

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O2

void license::LicenseGenerator::generateAndOutputLicenses(variables_map *vm,ostream *outputFile)

{
  pointer *__ptr;
  pointer this;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfo;
  string signature;
  string license;
  char pkey [888];
  long *local_408;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_400;
  string local_3e8 [32];
  string local_3c8;
  undefined1 local_3a8 [896];
  
  parseLicenseInfo(&local_400,vm);
  CryptoHelper::getInstance();
  memcpy(local_3a8,
         "-----BEGIN RSA PRIVATE KEY-----\nMIICXAIBAAKBgQDDG1SYPM3lglPwaw5P25GNdO9cujVTUuepzhXHjGjL37iqc8Dl\nKric9EhpFZ6gMVQmoLQZZnViIwFzZ7u4jzskwal/ldXM5X5JBGtGWp5FmjhHPa+/\nGqdJRlc2q6AyuU0IPQ1Au2FSwXa0eSuH55lKCam3itCkmY1P0chY0PjBfwIDAQAB\nAoGBAJZPpfqrTYz1vSlJsPsBE7/BSO9NXevVwThm1wynNc1rjF91UjS7lwMEiAy9\nZTnRBx3DTT0MXH7ArUt1rX/giRTN6oKVQeM2LA60lgi32I634llDs5h4dypb1rhq\nzZQbhjGkevKLuLzES43kJjli0olVFvPZ8d2m9exRWeddYoixAkEA38JXMtuKAMRB\nBExiRlwISHc2M2HejVbo5H94SjxlTDZ8Yte5RObQoPD3Nrf5UfVuM1fbNNG8FoUy\nYHC1kFAq+wJBAN84G5m5c0D4MFYrlJPH3qof0JDgRCxUtmZmiui3atqLXthKHpr6\ncJ580yJoDLqDAzHgxIgFVuYBnlgHvHILPE0CQHbB74PXjywO/S7p13LeX6sOUl78\n/6BmUx8LJG3KFj1X4baYJgWSt4HjwmFxTUsZhs6LP5WOB1Swhuc2ira4RccCQDWZ\nqn8CWhuavTij5FyMHPqrAxEW2Sfv+5ChRO/Ww1DRMKgtPCYoxww3mxdi9tN+jDDY\n8ThcV96JOvWWffjAm+0CQCjQn0RF/e4PKkuFZln7dORJVml1IGKTZtPMaAssix0h\ntrQWlLOHLF6X4BEbf9TxRBbmPrwzeqZmXu8Yyp8zP9Q=\n-----END RSA PRIVATE KEY-----\n"
         ,0x378);
  for (this = local_400.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
      this != local_400.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
    FullLicenseInfo::printForSign_abi_cxx11_(&local_3c8,this);
    (**(code **)(*local_408 + 0x18))(local_3e8,local_408,local_3a8,0x378,&local_3c8);
    std::__cxx11::string::_M_assign((string *)&this->license_signature);
    FullLicenseInfo::printAsIni(this,outputFile);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
  }
  if (local_408 != (long *)0x0) {
    (**(code **)(*local_408 + 0x28))();
  }
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&local_400);
  return;
}

Assistant:

void LicenseGenerator::generateAndOutputLicenses(const po::variables_map& vm,
		ostream& outputFile) {
	vector<FullLicenseInfo> licenseInfo = parseLicenseInfo(vm);
	unique_ptr<CryptoHelper> helper = CryptoHelper::getInstance();
	const char pkey[] = PRIVATE_KEY;
	size_t len = sizeof(pkey);
	for (auto it = licenseInfo.begin(); it != licenseInfo.end(); ++it) {
		const string license = it->printForSign();
		string signature = helper->signString((const void *)pkey,len,license);
		it->license_signature = signature;
		it->printAsIni(outputFile);
	}
}